

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O2

void __thiscall efsw::FileWatcherGeneric::removeWatch(FileWatcherGeneric *this,WatchID watchid)

{
  WatcherGeneric *pWVar1;
  const_iterator __position;
  Lock lock;
  Lock local_20;
  
  __position._M_current =
       (this->mWatches).
       super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  while( true ) {
    if (__position._M_current ==
        (this->mWatches).
        super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return;
    }
    pWVar1 = *__position._M_current;
    if ((pWVar1->super_Watcher).ID == watchid) break;
    __position._M_current = __position._M_current + 1;
  }
  local_20.mMutex = &this->mWatchesLock;
  Mutex::lock(local_20.mMutex);
  std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::erase
            (&this->mWatches,__position);
  (*(pWVar1->super_Watcher)._vptr_Watcher[1])(pWVar1);
  Lock::~Lock(&local_20);
  return;
}

Assistant:

void FileWatcherGeneric::removeWatch( WatchID watchid ) {
	WatchList::iterator it = mWatches.begin();

	for ( ; it != mWatches.end(); ++it ) {
		if ( ( *it )->ID == watchid ) {
			WatcherGeneric* watch = ( *it );

			Lock lock( mWatchesLock );

			mWatches.erase( it );

			efSAFE_DELETE( watch );

			return;
		}
	}
}